

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O2

void __thiscall cmCPackLog::cmCPackLog(cmCPackLog *this)

{
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackLog_005bb850;
  (this->Prefix)._M_dataplus._M_p = (pointer)&(this->Prefix).field_2;
  (this->Prefix)._M_string_length = 0;
  (this->Prefix).field_2._M_local_buf[0] = '\0';
  (this->OutputPrefix)._M_dataplus._M_p = (pointer)&(this->OutputPrefix).field_2;
  (this->OutputPrefix)._M_string_length = 0;
  (this->OutputPrefix).field_2._M_local_buf[0] = '\0';
  (this->VerbosePrefix)._M_dataplus._M_p = (pointer)&(this->VerbosePrefix).field_2;
  (this->VerbosePrefix)._M_string_length = 0;
  (this->VerbosePrefix).field_2._M_local_buf[0] = '\0';
  (this->DebugPrefix)._M_dataplus._M_p = (pointer)&(this->DebugPrefix).field_2;
  (this->DebugPrefix)._M_string_length = 0;
  (this->DebugPrefix).field_2._M_local_buf[0] = '\0';
  (this->WarningPrefix)._M_dataplus._M_p = (pointer)&(this->WarningPrefix).field_2;
  (this->WarningPrefix)._M_string_length = 0;
  (this->WarningPrefix).field_2._M_local_buf[0] = '\0';
  (this->ErrorPrefix)._M_dataplus._M_p = (pointer)&(this->ErrorPrefix).field_2;
  (this->ErrorPrefix)._M_string_length = 0;
  (this->ErrorPrefix).field_2._M_local_buf[0] = '\0';
  (this->LogOutputFileName)._M_dataplus._M_p = (pointer)&(this->LogOutputFileName).field_2;
  (this->LogOutputFileName)._M_string_length = 0;
  (this->LogOutputFileName).field_2._M_local_buf[0] = '\0';
  this->Verbose = false;
  this->Debug = false;
  this->Quiet = false;
  this->NewLine = true;
  this->LastTag = 0;
  this->DefaultOutput = (ostream *)&std::cout;
  this->DefaultError = (ostream *)&std::cerr;
  this->LogOutput = (ostream *)0x0;
  this->LogOutputCleanup = false;
  return;
}

Assistant:

cmCPackLog::cmCPackLog()
{
  this->Verbose = false;
  this->Debug = false;
  this->Quiet = false;
  this->NewLine = true;

  this->LastTag = cmCPackLog::NOTAG;
#undef cerr
#undef cout
  this->DefaultOutput = &std::cout;
  this->DefaultError = &std::cerr;

  this->LogOutput = 0;
  this->LogOutputCleanup = false;
}